

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O0

uint32_t google::protobuf::internal::GetRecodedTagForFastParsing(FieldDescriptor *field)

{
  uint32_t uVar1;
  FieldDescriptor *field_local;
  
  uVar1 = WireFormat::MakeTag(field);
  uVar1 = TcParseTableBase::RecodeTagForFastParsing(uVar1);
  return uVar1;
}

Assistant:

uint32_t GetRecodedTagForFastParsing(const FieldDescriptor* field) {
  return internal::TcParseTableBase::RecodeTagForFastParsing(
      internal::WireFormat::MakeTag(field));
}